

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall
cmCTest::HandleScriptArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *SRArgumentSpecified)

{
  ulong uVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  cmCTestScriptHandler *pcVar5;
  char *pcVar6;
  cmCTestScriptHandler *ch_2;
  cmCTestScriptHandler *ch_1;
  cmCTestScriptHandler *ch;
  undefined1 local_48 [8];
  string arg;
  bool *SRArgumentSpecified_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  size_t *i_local;
  cmCTest *this_local;
  
  arg.field_2._8_8_ = SRArgumentSpecified;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,*i);
  std::__cxx11::string::string((string *)local_48,(string *)pvVar3);
  bVar2 = CheckArgument(this,(string *)local_48,"-SP","--script-new-process");
  if ((bVar2) &&
     (uVar1 = *i,
     sVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(args), uVar1 < sVar4 - 1)) {
    this->RunConfigurationScript = true;
    *i = *i + 1;
    pcVar5 = (cmCTestScriptHandler *)GetHandler(this,"script");
    if ((*(byte *)arg.field_2._8_8_ & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,*i);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTestScriptHandler::AddConfigurationScript(pcVar5,pcVar6,false);
    }
  }
  bVar2 = CheckArgument(this,(string *)local_48,"-SR","--script-run");
  if ((bVar2) &&
     (uVar1 = *i,
     sVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(args), uVar1 < sVar4 - 1)) {
    *(undefined1 *)arg.field_2._8_8_ = 1;
    this->RunConfigurationScript = true;
    *i = *i + 1;
    pcVar5 = (cmCTestScriptHandler *)GetHandler(this,"script");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTestScriptHandler::AddConfigurationScript(pcVar5,pcVar6,true);
  }
  bVar2 = CheckArgument(this,(string *)local_48,"-S","--script");
  if ((bVar2) &&
     (uVar1 = *i,
     sVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(args), uVar1 < sVar4 - 1)) {
    this->RunConfigurationScript = true;
    *i = *i + 1;
    pcVar5 = (cmCTestScriptHandler *)GetHandler(this,"script");
    if ((*(byte *)arg.field_2._8_8_ & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,*i);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTestScriptHandler::AddConfigurationScript(pcVar5,pcVar6,true);
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmCTest::HandleScriptArguments(size_t& i, std::vector<std::string>& args,
                                    bool& SRArgumentSpecified)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-SP", "--script-new-process") &&
      i < args.size() - 1) {
    this->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch =
      static_cast<cmCTestScriptHandler*>(this->GetHandler("script"));
    // -SR is an internal argument, -SP should be ignored when it is passed
    if (!SRArgumentSpecified) {
      ch->AddConfigurationScript(args[i].c_str(), false);
    }
  }

  if (this->CheckArgument(arg, "-SR", "--script-run") && i < args.size() - 1) {
    SRArgumentSpecified = true;
    this->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch =
      static_cast<cmCTestScriptHandler*>(this->GetHandler("script"));
    ch->AddConfigurationScript(args[i].c_str(), true);
  }

  if (this->CheckArgument(arg, "-S", "--script") && i < args.size() - 1) {
    this->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch =
      static_cast<cmCTestScriptHandler*>(this->GetHandler("script"));
    // -SR is an internal argument, -S should be ignored when it is passed
    if (!SRArgumentSpecified) {
      ch->AddConfigurationScript(args[i].c_str(), true);
    }
  }
}